

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
cnn::Concatenate::forward_impl
          (Concatenate *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  uint uVar1;
  pointer ppTVar2;
  Tensor *this_00;
  ulong uVar3;
  pointer ppTVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *__range1;
  DstEvaluatorType dstEvaluator;
  SrcEvaluatorType srcEvaluator;
  assign_op<float,_float> local_119;
  Tensor *local_118;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_110;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
  local_f0;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_d0;
  DstEvaluatorType local_b0;
  SrcEvaluatorType local_98;
  DstXprType local_80;
  
  local_118 = fx;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->src_row_indices,
             (long)(xs->
                   super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(xs->
                   super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 3);
  ppTVar4 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppTVar2 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppTVar4 != ppTVar2) {
    uVar5 = 0;
    uVar3 = 0;
    do {
      this_00 = *ppTVar4;
      (this->src_row_indices).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar3] = uVar5;
      uVar1 = (this_00->d).d[0];
      uVar7 = (ulong)uVar1;
      Tensor::operator*(&local_d0,this_00);
      Tensor::operator*(&local_110,local_118);
      uVar6 = (ulong)uVar5;
      local_80.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
      .m_data = local_110.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data + uVar6;
      local_80.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
      .m_cols.m_value =
           local_110.
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_cols.m_value;
      local_80.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
      .
      super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
      .
      super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
      .m_rows.m_value = uVar7;
      if (local_110.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value < 0 &&
          local_110.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_data != (PointerType)0x0) {
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                      "Eigen::MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<float, -1, -1>>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Map<Eigen::Matrix<float, -1, -1>>>, Level = 0]"
                     );
      }
      local_80.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
      .m_xpr.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_cols.m_value =
           local_110.
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_cols.m_value;
      local_80.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
      .m_xpr.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_data = local_110.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
      local_80.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
      .m_xpr.
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
      .
      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
      .m_rows.m_value =
           local_110.
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value;
      local_80.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
      .m_startCol.m_value = 0;
      local_80.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
      .m_outerStride =
           local_110.
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value;
      local_80.
      super_BlockImpl<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
      .m_startRow.m_value = uVar6;
      if ((local_110.
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_cols.m_value < 0) ||
         ((long)(local_110.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_rows.m_value - uVar7) < (long)uVar6)) {
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<Eigen::Map<Eigen::Matrix<float, -1, -1>>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Map<Eigen::Matrix<float, -1, -1>>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                     );
      }
      local_98.
      super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
      .m_data = local_d0.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
      local_98.
      super_mapbase_evaluator<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
      .m_outerStride.m_value =
           local_d0.
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value;
      if ((local_d0.
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value != uVar7) ||
         (local_110.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value !=
          local_d0.
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
          .
          super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
          .m_cols.m_value)) {
        __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                      "void Eigen::DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<float, -1, -1>>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Map<Eigen::Matrix<float, -1, -1>>>]"
                     );
      }
      local_b0.
      super_block_evaluator<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
      .
      super_mapbase_evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
      .m_outerStride.m_value =
           local_110.
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
           .
           super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
           .m_rows.m_value;
      local_f0.m_dst = &local_b0;
      local_f0.m_src = &local_98;
      local_f0.m_functor = &local_119;
      local_f0.m_dstExpr = &local_80;
      local_b0.
      super_block_evaluator<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
      .
      super_mapbase_evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
      .m_data = local_80.
                super_BlockImpl<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_Eigen::Dense>
                .
                super_BlockImpl_dense<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false,_true>
                .
                super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_1>
                .
                super_MapBase<Eigen::Block<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>,_0>
                .m_data;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_4,_0>
      ::run(&local_f0);
      uVar5 = uVar5 + uVar1;
      ppTVar4 = ppTVar4 + 1;
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (ppTVar4 != ppTVar2);
  }
  return;
}

Assistant:

void Concatenate::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
  unsigned rows = 0;
  for (auto x : xs) rows += x->d.rows();
  // the following should use auxiliary memory
  src_row_indices.resize(xs.size());
  unsigned ind = 0;
  unsigned k = 0;
  for (auto x : xs) {
    src_row_indices[k++] = ind;
    auto & xi = *x;
    const unsigned rows = xi.d.rows();
#if HAVE_CUDA
    assert(xi.d.cols() == 1); // this can be relaxed to the same everywhere
    CUDA_CHECK(cudaMemcpyAsync(&fx.v[ind], &xi.v[0], sizeof(float) * rows, cudaMemcpyDeviceToDevice));
#else
    (*fx).middleRows(ind, rows) = *xi;
#endif
    ind += rows;
  }
}